

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listelem_alloc.c
# Opt level: O0

void * listelem_get_item(listelem_alloc_t *list,int32 id)

{
  uint uVar1;
  glist_t local_30;
  gnode_t *gn;
  int32 i;
  int32 ptridx;
  int32 blkidx;
  int32 id_local;
  listelem_alloc_t *list_local;
  
  gn._0_4_ = 0;
  uVar1 = (int)list->n_blocks - (id >> 0x10 & 0xffffU);
  local_30 = list->blocks;
  while ((local_30 != (glist_t)0x0 && (gn._0_4_ = (uint)gn + 1, (uint)gn != uVar1))) {
    local_30 = local_30->next;
  }
  if (local_30 == (glist_t)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/listelem_alloc.c"
            ,0xf9,"Failed to find block index %d\n",(ulong)uVar1);
    list_local = (listelem_alloc_t *)0x0;
  }
  else {
    list_local = (listelem_alloc_t *)
                 ((long)(local_30->data).ptr + (long)(int)(id & 0xffff) * (list->elemsize >> 3) * 8)
    ;
  }
  return list_local;
}

Assistant:

void *
listelem_get_item(listelem_alloc_t *list, int32 id)
{
    int32 blkidx, ptridx, i;
    gnode_t *gn;

    blkidx = (id >> BLKID_SHIFT) & BLKID_MASK;
    ptridx = id & BLKID_MASK;

    i = 0;
    blkidx = list->n_blocks - blkidx;
    for (gn = list->blocks; gn; gn = gnode_next(gn)) {
        if (++i == blkidx)
            break;
    }
    if (gn == NULL) {
        E_ERROR("Failed to find block index %d\n", blkidx);
        return NULL;
    }

    return (void *)((char **)gnode_ptr(gn)
                    + ptridx * (list->elemsize / sizeof(void *)));
}